

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O1

int setfillcol(int f,int n)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char local_48 [8];
  char buf [32];
  char *es;
  
  iVar1 = n;
  if ((f & 7U) == 0) {
    pcVar3 = eread("Set fill-column: ",local_48,0x20,0x18);
    if (pcVar3 == (char *)0x0) {
      return 2;
    }
    if (*pcVar3 == '\0') {
      return 0;
    }
    uVar2 = strtonum(pcVar3,0,0x7fffffff,buf + 0x18);
    if (buf._24_8_ != 0) {
      dobeep();
      ewprintf("Invalid fill column: %s",pcVar3);
      return 0;
    }
    fillcol = uVar2;
    ewprintf("Fill column set to %d",(ulong)uVar2);
    iVar1 = fillcol;
  }
  fillcol = iVar1;
  return 1;
}

Assistant:

int
setfillcol(int f, int n)
{
	char buf[32], *rep;
	const char *es;
	int nfill;

	if ((f & FFARG) != 0) {
		fillcol = n;
	} else {
		if ((rep = eread("Set fill-column: ", buf, sizeof(buf),
		    EFNEW | EFCR)) == NULL)
			return (ABORT);
		else if (rep[0] == '\0')
			return (FALSE);
		nfill = strtonum(rep, 0, INT_MAX, &es);
		if (es != NULL) {
			dobeep();
			ewprintf("Invalid fill column: %s", rep);
			return (FALSE);
		}
		fillcol = nfill;
		ewprintf("Fill column set to %d", fillcol);
	}
	return (TRUE);
}